

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_avx2.c
# Opt level: O0

_Bool av1_resize_vert_dir_avx2
                (uint8_t *intbuf,uint8_t *output,int out_stride,int height,int height2,int stride,
                int start_col)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  int iVar92;
  undefined1 (*pauVar93) [16];
  ulong *puVar94;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  int in_stack_00000008;
  __m128i s10s11_1;
  int is_store_valid_1;
  __m256i res_a_round_2_3;
  __m256i res_a_round_1_3;
  __m256i res_out_3 [2];
  __m128i s89_1;
  int idx2_3;
  int idx1_3;
  int i_2;
  __m128i s10s11;
  int idx8_1;
  int idx7_1;
  __m256i res_a_round_2_2;
  __m256i res_a_round_1_2;
  __m256i res_out_2 [2];
  __m128i s89;
  int idx2_2;
  int idx1_2;
  int i_3;
  int process_ht_1;
  __m128i s67;
  __m128i s45;
  __m128i s23;
  __m128i s01;
  __m128i l11_1;
  __m128i l10_1;
  __m128i l5_1;
  __m128i l9_1;
  __m128i l8_1;
  __m128i l7_1;
  __m128i l6_1;
  __m128i l4_1;
  __m128i l2_1;
  __m128i l1_1;
  __m128i l0_1;
  __m128i l3_1;
  uint8_t *data_1;
  int processed_wd;
  __m256i s911_1;
  __m256i s810_1;
  int is_store_valid;
  __m256i res_8bit1_1;
  __m256i res_8bit0_1;
  __m256i res_b_round_2_1;
  __m256i res_b_round_1_1;
  __m256i res_out_b_1 [2];
  __m256i res_a_round_2_1;
  __m256i res_a_round_1_1;
  __m256i res_out_1 [2];
  __m256i s79_1;
  __m256i s68_1;
  int idx2_1;
  int idx1_1;
  int i;
  __m256i s911;
  __m256i s810;
  int idx8;
  int idx7;
  __m256i res_8bit1;
  __m256i res_8bit0;
  __m256i res_b_round_2;
  __m256i res_b_round_1;
  __m256i res_out_b [2];
  __m256i res_a_round_2;
  __m256i res_a_round_1;
  __m256i res_out [2];
  __m256i s79;
  __m256i s68;
  int idx2;
  int idx1;
  int i_1;
  int process_ht;
  __m256i s57;
  __m256i s46;
  __m256i s35;
  __m256i s24;
  __m256i s13;
  __m256i s02;
  __m128i l11;
  __m128i l10;
  __m128i l5;
  __m128i l9;
  __m128i l8;
  __m128i l7;
  __m128i l6;
  __m128i l4;
  __m128i l2;
  __m128i l1;
  __m128i l0;
  __m128i l3;
  uint8_t *data;
  int j;
  int remain_row;
  int remain_col;
  int num_col16;
  __m256i zero;
  __m256i clip_pixel;
  uint8_t max_pixel;
  __m256i round_const_bits;
  __m128i round_shift_bits;
  int bits;
  __m256i coeffs_y [4];
  __m256i s [10];
  int local_2198;
  int local_2194;
  int local_2190;
  int local_218c;
  int local_2188;
  int local_2184;
  undefined8 uVar98;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined1 in_stack_ffffffffffffde80 [32];
  undefined1 auVar99 [32];
  undefined8 uVar102;
  int start_col_00;
  longlong *in_stack_ffffffffffffdea8;
  int local_2150;
  int local_214c;
  int local_2148;
  int local_2144;
  ulong uStack_2138;
  int local_2110;
  int local_210c;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 *puStack_20a8;
  undefined8 uStack_2098;
  undefined1 in_stack_ffffffffffffdfa0 [16];
  undefined1 auVar103 [16];
  undefined4 in_stack_ffffffffffffdfb0;
  undefined4 in_stack_ffffffffffffdfb4;
  int local_2044;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 *puStack_1fe8;
  undefined8 uStack_1fd8;
  undefined8 local_1f90;
  undefined8 uStack_1f88;
  int local_1f78;
  undefined8 local_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 local_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  ulong local_1f30;
  ulong local_1f20;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cd8;
  int local_1c64;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 uStack_1af8;
  int local_1a68;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 local_1990;
  undefined8 uStack_1988;
  int local_18d0;
  int local_18c8;
  longlong local_1820 [16];
  undefined1 local_17a0 [32];
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined1 local_1740 [24];
  __m256i *palStack_1728;
  undefined1 local_1720 [32];
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  int local_1648;
  uint local_1640;
  int local_163c;
  long local_1638;
  long local_1630;
  _Bool local_1621;
  undefined1 local_1620 [16];
  undefined4 local_160c;
  undefined4 local_1608;
  undefined1 local_1601;
  undefined1 local_1600 [32];
  undefined1 (*local_15d8) [16];
  undefined1 (*local_15d0) [16];
  undefined8 *local_15c8;
  undefined8 *local_15c0;
  undefined1 (*local_15b8) [16];
  undefined1 (*local_15b0) [16];
  undefined8 *local_15a8;
  undefined8 *local_15a0;
  undefined1 (*local_1598) [16];
  undefined1 (*local_1590) [16];
  undefined1 (*local_1588) [16];
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 local_1570;
  undefined8 uStack_1568;
  __m256i *local_1560;
  __m256i *palStack_1558;
  undefined8 local_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 local_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 local_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 local_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 local_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 local_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 local_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 local_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 local_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 local_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 local_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 local_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 local_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  ulong uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  ulong uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  ulong uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  ulong local_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  ulong local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  ulong local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  ulong local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  ulong local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  ulong local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  ulong local_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  ulong local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  ulong local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  ulong local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  ulong local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  ulong local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  ulong uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  ulong uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  ulong uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  ulong uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 *local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 *local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 *puStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 *puStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  ulong local_3e0;
  undefined8 uStack_3d8;
  ulong *local_3c8;
  ulong local_3c0;
  undefined8 uStack_3b8;
  ulong *local_3a8;
  ulong local_3a0;
  undefined8 uStack_398;
  ulong *local_388;
  ulong local_380;
  undefined8 uStack_378;
  ulong *local_368;
  ulong local_360;
  undefined8 uStack_358;
  ulong *local_348;
  ulong local_340;
  undefined8 uStack_338;
  ulong *local_328;
  ulong local_320;
  undefined8 uStack_318;
  ulong *local_308;
  ulong local_300;
  undefined8 uStack_2f8;
  ulong *local_2e8;
  ulong local_2e0;
  undefined8 uStack_2d8;
  ulong *local_2c8;
  ulong local_2c0;
  undefined8 uStack_2b8;
  ulong *local_2a8;
  ulong local_2a0;
  undefined8 uStack_298;
  ulong *local_288;
  ulong local_280;
  undefined8 uStack_278;
  ulong local_270;
  undefined8 uStack_268;
  ulong local_260;
  undefined8 uStack_258;
  ulong local_250;
  undefined8 uStack_248;
  ulong local_240;
  undefined8 uStack_238;
  ulong local_230;
  undefined8 uStack_228;
  ulong local_220;
  undefined8 uStack_218;
  ulong local_210;
  undefined8 uStack_208;
  ulong local_200;
  undefined8 uStack_1f8;
  ulong local_1f0;
  undefined8 uStack_1e8;
  ulong local_1e0;
  undefined8 uStack_1d8;
  ulong local_1d0;
  undefined8 uStack_1c8;
  ulong local_1c0;
  undefined8 uStack_1b8;
  ulong local_1b0;
  undefined8 uStack_1a8;
  ulong local_1a0;
  undefined8 uStack_198;
  ulong local_190;
  undefined8 uStack_188;
  ulong local_180;
  undefined8 uStack_178;
  ulong local_170;
  undefined8 uStack_168;
  ulong local_160;
  undefined8 uStack_158;
  ulong local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_130;
  undefined8 *local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 uStack_f0;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 *local_c8;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  if (((in_ECX & 1) == 0) && (7 < (int)in_ECX)) {
    local_160c = 7;
    local_1620 = ZEXT416(7);
    uVar82 = local_1620._0_8_;
    local_1608 = 0x40;
    local_84 = 0x40;
    local_88 = 0x40;
    local_8c = 0x40;
    local_90 = 0x40;
    local_94 = 0x40;
    local_98 = 0x40;
    local_9c = 0x40;
    local_a0 = 0x40;
    auVar3 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
    auVar3 = vpinsrd_avx(auVar3,0x40,2);
    auVar4 = vpinsrd_avx(auVar3,0x40,3);
    auVar3 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
    auVar3 = vpinsrd_avx(auVar3,0x40,2);
    auStack_b0 = vpinsrd_avx(auVar3,0x40,3);
    local_c0._0_8_ = auVar4._0_8_;
    uVar84 = local_c0._0_8_;
    local_c0._8_8_ = auVar4._8_8_;
    uVar85 = local_c0._8_8_;
    uVar86 = auStack_b0._0_8_;
    uVar87 = auStack_b0._8_8_;
    local_1601 = 0xff;
    local_31 = 0xff;
    local_32 = 0xff;
    local_33 = 0xff;
    local_34 = 0xff;
    local_35 = 0xff;
    local_36 = 0xff;
    local_37 = 0xff;
    local_38 = 0xff;
    local_39 = 0xff;
    local_3a = 0xff;
    local_3b = 0xff;
    local_3c = 0xff;
    local_3d = 0xff;
    local_3e = 0xff;
    local_3f = 0xff;
    local_40 = 0xff;
    local_41 = 0xff;
    local_42 = 0xff;
    local_43 = 0xff;
    local_44 = 0xff;
    local_45 = 0xff;
    local_46 = 0xff;
    local_47 = 0xff;
    local_48 = 0xff;
    local_49 = 0xff;
    local_4a = 0xff;
    local_4b = 0xff;
    local_4c = 0xff;
    local_4d = 0xff;
    local_4e = 0xff;
    local_4f = 0xff;
    local_50 = 0xff;
    auVar3 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
    auVar3 = vpinsrb_avx(auVar3,0xff,2);
    auVar3 = vpinsrb_avx(auVar3,0xff,3);
    auVar3 = vpinsrb_avx(auVar3,0xff,4);
    auVar3 = vpinsrb_avx(auVar3,0xff,5);
    auVar3 = vpinsrb_avx(auVar3,0xff,6);
    auVar3 = vpinsrb_avx(auVar3,0xff,7);
    auVar3 = vpinsrb_avx(auVar3,0xff,8);
    auVar3 = vpinsrb_avx(auVar3,0xff,9);
    auVar3 = vpinsrb_avx(auVar3,0xff,10);
    auVar3 = vpinsrb_avx(auVar3,0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xff,0xc);
    auVar3 = vpinsrb_avx(auVar3,0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,0xff,0xe);
    auVar3 = vpinsrb_avx(auVar3,0xff,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
    auVar2 = vpinsrb_avx(auVar2,0xff,2);
    auVar2 = vpinsrb_avx(auVar2,0xff,3);
    auVar2 = vpinsrb_avx(auVar2,0xff,4);
    auVar2 = vpinsrb_avx(auVar2,0xff,5);
    auVar2 = vpinsrb_avx(auVar2,0xff,6);
    auVar2 = vpinsrb_avx(auVar2,0xff,7);
    auVar2 = vpinsrb_avx(auVar2,0xff,8);
    auVar2 = vpinsrb_avx(auVar2,0xff,9);
    auVar2 = vpinsrb_avx(auVar2,0xff,10);
    auVar2 = vpinsrb_avx(auVar2,0xff,0xb);
    auVar2 = vpinsrb_avx(auVar2,0xff,0xc);
    auVar2 = vpinsrb_avx(auVar2,0xff,0xd);
    auVar2 = vpinsrb_avx(auVar2,0xff,0xe);
    auStack_70 = vpinsrb_avx(auVar2,0xff,0xf);
    local_80._0_8_ = auVar3._0_8_;
    uVar88 = local_80._0_8_;
    local_80._8_8_ = auVar3._8_8_;
    uVar89 = local_80._8_8_;
    uVar90 = auStack_70._0_8_;
    uVar91 = auStack_70._8_8_;
    local_1600._8_8_ = SUB328(ZEXT832(0),4);
    uVar83 = local_1600._8_8_;
    uVar81 = 0;
    local_1648 = in_R9D;
    local_1640 = in_ECX;
    local_163c = in_EDX;
    local_1638 = in_RSI;
    local_1630 = in_RDI;
    local_1600 = ZEXT832(0) << 0x20;
    local_c0 = auVar4;
    local_80 = auVar3;
    prepare_filter_coeffs(av1_down2_symeven_half_filter,(__m256i *)local_1820);
    iVar92 = local_1648 / 0x10;
    local_18c8 = local_1648 % 0x10;
    local_2044 = 6;
    if ((int)local_1640 % 4 == 0) {
      local_2044 = 4;
    }
    for (local_18d0 = in_stack_00000008; start_col_00 = (int)in_stack_ffffffffffffdea8,
        local_18d0 < local_1648 - local_18c8; local_18d0 = local_18d0 + 0x10) {
      pauVar93 = (undefined1 (*) [16])(local_1630 + local_18d0);
      local_1350 = *(undefined8 *)*pauVar93;
      uStack_1348 = *(undefined8 *)(*pauVar93 + 8);
      local_1590 = (undefined1 (*) [16])(*pauVar93 + local_1648);
      local_1370 = *(undefined8 *)*local_1590;
      uStack_1368 = *(undefined8 *)(*local_1590 + 8);
      local_1598 = (undefined1 (*) [16])(*pauVar93 + local_1648 * 2);
      local_1390 = *(undefined8 *)*local_1598;
      uStack_1388 = *(undefined8 *)(*local_1598 + 8);
      local_15a0 = (undefined8 *)(*pauVar93 + local_1648 * 3);
      local_1990 = *local_15a0;
      uStack_1988 = local_15a0[1];
      local_15a8 = (undefined8 *)(*pauVar93 + (local_1648 << 2));
      local_19a0 = *local_15a8;
      uStack_1998 = local_15a8[1];
      auVar22._16_8_ = local_1350;
      auVar22._0_16_ = *pauVar93;
      auVar22._24_8_ = uStack_1348;
      auVar99._16_8_ = local_1350;
      auVar99._0_16_ = *pauVar93;
      auVar99._24_8_ = uStack_1348;
      local_17a0 = vpunpcklbw_avx2(auVar22,auVar99);
      auVar9._16_8_ = local_1370;
      auVar9._0_16_ = *pauVar93;
      auVar9._24_8_ = uStack_1368;
      auVar8._16_8_ = local_1390;
      auVar8._0_16_ = *pauVar93;
      auVar8._24_8_ = uStack_1388;
      local_1780 = vpunpcklbw_avx2(auVar9,auVar8);
      auVar95._16_8_ = local_1990;
      auVar95._0_16_ = *local_1590;
      auVar95._24_8_ = uStack_1988;
      auVar7._16_8_ = local_19a0;
      auVar7._0_16_ = *local_1598;
      auVar7._24_8_ = uStack_1998;
      local_1760 = vpunpcklbw_avx2(auVar95,auVar7);
      auVar36._16_8_ = local_1350;
      auVar36._0_16_ = *pauVar93;
      auVar36._24_8_ = uStack_1348;
      auVar35._16_8_ = local_1350;
      auVar35._0_16_ = *pauVar93;
      auVar35._24_8_ = uStack_1348;
      local_1700 = vpunpckhbw_avx2(auVar36,auVar35);
      auVar34._16_8_ = local_1370;
      auVar34._0_16_ = *pauVar93;
      auVar34._24_8_ = uStack_1368;
      auVar33._16_8_ = local_1390;
      auVar33._0_16_ = *pauVar93;
      auVar33._24_8_ = uStack_1388;
      local_16e0 = vpunpckhbw_avx2(auVar34,auVar33);
      auVar32._16_8_ = local_1990;
      auVar32._0_16_ = *local_1590;
      auVar32._24_8_ = uStack_1988;
      auVar31._16_8_ = local_19a0;
      auVar31._0_16_ = *local_1598;
      auVar31._24_8_ = uStack_1998;
      local_16c0 = vpunpckhbw_avx2(auVar32,auVar31);
      local_1c64 = local_1640 - local_2044;
      local_1588 = pauVar93;
      local_13a0 = local_19a0;
      uStack_1398 = uStack_1998;
      local_1380 = local_1990;
      uStack_1378 = uStack_1988;
      local_1360 = local_1390;
      uStack_1358 = uStack_1388;
      local_1340 = local_1370;
      uStack_1338 = uStack_1368;
      local_1330 = local_1350;
      uStack_1328 = uStack_1348;
      local_1320 = local_1350;
      uStack_1318 = uStack_1348;
      local_1310 = local_1350;
      uStack_1308 = uStack_1348;
      local_1300 = local_1350;
      uStack_12f8 = uStack_1348;
      local_12f0 = local_1350;
      uStack_12e8 = uStack_1348;
      local_11e0 = local_1390;
      uStack_11d8 = uStack_1388;
      uStack_11d0 = local_19a0;
      uStack_11c8 = uStack_1998;
      local_11c0 = local_1370;
      uStack_11b8 = uStack_1368;
      uStack_11b0 = local_1990;
      uStack_11a8 = uStack_1988;
      local_11a0 = local_1350;
      uStack_1198 = uStack_1348;
      uStack_1190 = local_1390;
      uStack_1188 = uStack_1388;
      local_1180 = local_1350;
      uStack_1178 = uStack_1348;
      uStack_1170 = local_1370;
      uStack_1168 = uStack_1368;
      local_1160 = local_1350;
      uStack_1158 = uStack_1348;
      uStack_1150 = local_1350;
      uStack_1148 = uStack_1348;
      local_1140 = local_1350;
      uStack_1138 = uStack_1348;
      uStack_1130 = local_1350;
      uStack_1128 = uStack_1348;
      local_1020 = local_1390;
      uStack_1018 = uStack_1388;
      uStack_1010 = local_19a0;
      uStack_1008 = uStack_1998;
      local_1000 = local_1370;
      uStack_ff8 = uStack_1368;
      uStack_ff0 = local_1990;
      uStack_fe8 = uStack_1988;
      local_fe0 = local_1350;
      uStack_fd8 = uStack_1348;
      uStack_fd0 = local_1390;
      uStack_fc8 = uStack_1388;
      local_fc0 = local_1350;
      uStack_fb8 = uStack_1348;
      uStack_fb0 = local_1370;
      uStack_fa8 = uStack_1368;
      local_fa0 = local_1350;
      uStack_f98 = uStack_1348;
      uStack_f90 = local_1350;
      uStack_f88 = uStack_1348;
      local_f80 = local_1350;
      uStack_f78 = uStack_1348;
      uStack_f70 = local_1350;
      uStack_f68 = uStack_1348;
      for (local_1a68 = 0; local_1a68 < local_1c64; local_1a68 = local_1a68 + 4) {
        if ((int)(local_1640 - 1) < local_1a68 + 5) {
          local_210c = local_1640 - 1;
        }
        else {
          local_210c = local_1a68 + 5;
        }
        if ((int)(local_1640 - 1) < local_1a68 + 6) {
          local_2110 = local_1640 - 1;
        }
        else {
          local_2110 = local_1a68 + 6;
        }
        local_15b0 = (undefined1 (*) [16])(*pauVar93 + local_210c * local_1648);
        uVar10 = *(undefined8 *)*local_15b0;
        uVar11 = *(undefined8 *)(*local_15b0 + 8);
        auVar55 = *local_15b0;
        auVar53 = *local_15b0;
        local_15b8 = (undefined1 (*) [16])(*pauVar93 + local_2110 * local_1648);
        uVar12 = *(undefined8 *)*local_15b8;
        uVar13 = *(undefined8 *)(*local_15b8 + 8);
        auVar56 = *local_15b8;
        auVar54 = *local_15b8;
        local_13b0 = local_1990;
        uStack_13a8 = uStack_1988;
        local_13d0 = local_19a0;
        uStack_13c8 = uStack_1998;
        local_1200 = local_1990;
        uStack_11f8 = uStack_1988;
        local_1220 = local_19a0;
        uStack_1218 = uStack_1998;
        auVar21._8_8_ = uStack_1988;
        auVar21._0_8_ = local_1990;
        auVar21._16_8_ = uVar10;
        auVar21._24_8_ = uVar11;
        auVar20._8_8_ = uStack_1998;
        auVar20._0_8_ = local_19a0;
        auVar20._16_8_ = uVar12;
        auVar20._24_8_ = uVar13;
        _local_1740 = vpunpcklbw_avx2(auVar21,auVar20);
        local_1040 = local_1990;
        uStack_1038 = uStack_1988;
        local_1060 = local_19a0;
        uStack_1058 = uStack_1998;
        auVar30._8_8_ = uStack_1988;
        auVar30._0_8_ = local_1990;
        auVar30._16_8_ = uVar10;
        auVar30._24_8_ = uVar11;
        auVar29._8_8_ = uStack_1998;
        auVar29._0_8_ = local_19a0;
        auVar29._16_8_ = uVar12;
        auVar29._24_8_ = uVar13;
        local_16a0 = vpunpckhbw_avx2(auVar30,auVar29);
        local_13e0 = uVar12;
        uStack_13d8 = uVar13;
        local_13c0 = uVar10;
        uStack_13b8 = uVar11;
        uStack_1210 = uVar12;
        uStack_1208 = uVar13;
        uStack_11f0 = uVar10;
        uStack_11e8 = uVar11;
        uStack_1050 = uVar12;
        uStack_1048 = uVar13;
        uStack_1030 = uVar10;
        uStack_1028 = uVar11;
        resize_convolve((__m256i *)CONCAT44(in_stack_ffffffffffffdfb4,in_stack_ffffffffffffdfb0),
                        in_stack_ffffffffffffdfa0._8_8_,in_stack_ffffffffffffdfa0._0_8_);
        uStack_2138 = SUB328(ZEXT832(0),4);
        uStack_1af8 = SUB328(ZEXT832(0),4);
        local_c80 = 0;
        uStack_c78 = uStack_1af8;
        uStack_c70 = 0;
        uStack_c68 = 0;
        local_ca0 = uVar84;
        uStack_c98 = uVar85;
        uStack_c90 = uVar86;
        uStack_c88 = uVar87;
        auVar48._16_8_ = uVar86;
        auVar48._0_16_ = auVar4;
        auVar48._24_8_ = uVar87;
        auVar7 = vpaddd_avx2(ZEXT832(0) << 0x20,auVar48);
        local_cc0 = 0;
        uStack_cb8 = uStack_2138;
        uStack_cb0 = 0;
        uStack_ca8 = 0;
        local_ce0 = uVar84;
        uStack_cd8 = uVar85;
        uStack_cd0 = uVar86;
        uStack_cc8 = uVar87;
        auVar47._16_8_ = uVar86;
        auVar47._0_16_ = auVar4;
        auVar47._24_8_ = uVar87;
        auVar95 = vpaddd_avx2(ZEXT832(0) << 0x20,auVar47);
        local_1b20 = auVar7._0_8_;
        uStack_1b18 = auVar7._8_8_;
        uStack_1b10 = auVar7._16_8_;
        uStack_1b08 = auVar7._24_8_;
        local_980 = local_1b20;
        uStack_978 = uStack_1b18;
        uStack_970 = uStack_1b10;
        uStack_968 = uStack_1b08;
        local_990 = uVar82;
        uStack_988 = 0;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar82;
        auVar8 = vpsrad_avx2(auVar7,auVar6);
        local_1b40 = auVar95._0_8_;
        uStack_1b38 = auVar95._8_8_;
        uStack_1b30 = auVar95._16_8_;
        uStack_1b28 = auVar95._24_8_;
        local_9c0 = local_1b40;
        uStack_9b8 = uStack_1b38;
        uStack_9b0 = uStack_1b30;
        uStack_9a8 = uStack_1b28;
        local_9d0 = uVar82;
        uStack_9c8 = 0;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar82;
        auVar9 = vpsrad_avx2(auVar95,auVar5);
        resize_convolve((__m256i *)CONCAT44(in_stack_ffffffffffffdfb4,in_stack_ffffffffffffdfb0),
                        in_stack_ffffffffffffdfa0._8_8_,in_stack_ffffffffffffdfa0._0_8_);
        local_d00 = 0;
        uStack_cf8 = uStack_2138;
        uStack_cf0 = 0;
        uStack_ce8 = 0;
        local_d20 = uVar84;
        uStack_d18 = uVar85;
        uStack_d10 = uVar86;
        uStack_d08 = uVar87;
        auVar46._16_8_ = uVar86;
        auVar46._0_16_ = auVar4;
        auVar46._24_8_ = uVar87;
        auVar7 = vpaddd_avx2(ZEXT832(uStack_2138) << 0x40,auVar46);
        local_d40 = 0;
        uStack_d38 = uStack_2138;
        uStack_d30 = 0;
        uStack_d28 = 0;
        local_d60 = uVar84;
        uStack_d58 = uVar85;
        uStack_d50 = uVar86;
        uStack_d48 = uVar87;
        auVar45._16_8_ = uVar86;
        auVar45._0_16_ = auVar4;
        auVar45._24_8_ = uVar87;
        auVar95 = vpaddd_avx2(ZEXT832(uStack_2138) << 0x40,auVar45);
        local_1ba0 = auVar7._0_8_;
        local_a00 = local_1ba0;
        uStack_1b98 = auVar7._8_8_;
        uStack_9f8 = uStack_1b98;
        uStack_1b90 = auVar7._16_8_;
        uStack_9f0 = uStack_1b90;
        uStack_1b88 = auVar7._24_8_;
        uStack_9e8 = uStack_1b88;
        local_a10 = uVar82;
        uStack_a08 = 0;
        auVar103._8_8_ = 0;
        auVar103._0_8_ = uVar82;
        auVar99 = vpsrad_avx2(auVar7,auVar103);
        local_1bc0 = auVar95._0_8_;
        local_a40 = local_1bc0;
        uStack_1bb8 = auVar95._8_8_;
        uStack_a38 = uStack_1bb8;
        uStack_1bb0 = auVar95._16_8_;
        uStack_a30 = uStack_1bb0;
        uStack_1ba8 = auVar95._24_8_;
        uStack_a28 = uStack_1ba8;
        local_a50 = uVar82;
        uStack_a48 = 0;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar82;
        auVar95 = vpsrad_avx2(auVar95,auVar2);
        local_1b20 = auVar8._0_8_;
        local_800 = local_1b20;
        uStack_1b18 = auVar8._8_8_;
        uStack_7f8 = uStack_1b18;
        uStack_1b10 = auVar8._16_8_;
        uStack_7f0 = uStack_1b10;
        uStack_1b08 = auVar8._24_8_;
        uStack_7e8 = uStack_1b08;
        local_1b40 = auVar9._0_8_;
        local_820 = local_1b40;
        uStack_1b38 = auVar9._8_8_;
        uStack_818 = uStack_1b38;
        uStack_1b30 = auVar9._16_8_;
        uStack_810 = uStack_1b30;
        uStack_1b28 = auVar9._24_8_;
        uStack_808 = uStack_1b28;
        auVar7 = vpackusdw_avx2(auVar8,auVar9);
        local_1ba0 = auVar99._0_8_;
        local_840 = local_1ba0;
        uStack_1b98 = auVar99._8_8_;
        uStack_838 = uStack_1b98;
        uStack_1b90 = auVar99._16_8_;
        uStack_830 = uStack_1b90;
        uStack_1b88 = auVar99._24_8_;
        uStack_828 = uStack_1b88;
        local_1bc0 = auVar95._0_8_;
        local_860 = local_1bc0;
        uStack_1bb8 = auVar95._8_8_;
        uStack_858 = uStack_1bb8;
        uStack_1bb0 = auVar95._16_8_;
        uStack_850 = uStack_1bb0;
        uStack_1ba8 = auVar95._24_8_;
        uStack_848 = uStack_1ba8;
        auVar95 = vpackusdw_avx2(auVar99,auVar95);
        auVar7 = vpermq_avx2(auVar7,0xd8);
        auVar95 = vpermq_avx2(auVar95,0xd8);
        local_1be0 = auVar7._0_8_;
        local_700 = local_1be0;
        uStack_1bd8 = auVar7._8_8_;
        uStack_6f8 = uStack_1bd8;
        uStack_1bd0 = auVar7._16_8_;
        uStack_6f0 = uStack_1bd0;
        uStack_1bc8 = auVar7._24_8_;
        uStack_6e8 = uStack_1bc8;
        local_1c00 = auVar95._0_8_;
        local_720 = local_1c00;
        uStack_1bf8 = auVar95._8_8_;
        uStack_718 = uStack_1bf8;
        uStack_1bf0 = auVar95._16_8_;
        uStack_710 = uStack_1bf0;
        uStack_1be8 = auVar95._24_8_;
        uStack_708 = uStack_1be8;
        auVar7 = vpackuswb_avx2(auVar7,auVar95);
        local_1c00 = auVar7._0_8_;
        local_600 = local_1c00;
        uStack_1bf8 = auVar7._8_8_;
        uStack_5f8 = uStack_1bf8;
        uStack_1bf0 = auVar7._16_8_;
        uStack_5f0 = uStack_1bf0;
        uStack_1be8 = auVar7._24_8_;
        uStack_5e8 = uStack_1be8;
        local_620 = uVar88;
        uStack_618 = uVar89;
        uStack_610 = uVar90;
        uStack_608 = uVar91;
        auVar60._16_8_ = uVar90;
        auVar60._0_16_ = auVar3;
        auVar60._24_8_ = uVar91;
        auVar7 = vpminub_avx2(auVar7,auVar60);
        local_1be0 = auVar7._0_8_;
        local_500 = local_1be0;
        uStack_1bd8 = auVar7._8_8_;
        uStack_4f8 = uStack_1bd8;
        uStack_1bd0 = auVar7._16_8_;
        uStack_4f0 = uStack_1bd0;
        uStack_1bc8 = auVar7._24_8_;
        uStack_4e8 = uStack_1bc8;
        uStack_518 = uVar83;
        uStack_510 = 0;
        uStack_508 = 0;
        auVar7 = vpmaxub_avx2(auVar7,ZEXT832((ulong)uVar83) << 0x40);
        local_468 = (undefined8 *)(local_1638 + ((local_1a68 / 2) * local_163c + local_18d0));
        local_1be0 = auVar7._0_8_;
        local_400 = local_1be0;
        uStack_1bd8 = auVar7._8_8_;
        uStack_3f8 = uStack_1bd8;
        uStack_1bd0 = auVar7._16_8_;
        uStack_3f0 = uStack_1bd0;
        uStack_1bc8 = auVar7._24_8_;
        uStack_3e8 = uStack_1bc8;
        local_480 = local_1be0;
        uStack_478 = uStack_1bd8;
        *local_468 = local_1be0;
        local_468[1] = uStack_1bd8;
        local_488 = (undefined8 *)
                    (local_1638 + ((local_1a68 / 2) * local_163c + local_18d0 + local_163c));
        local_4a0 = uStack_1bd0;
        uStack_498 = uStack_1bc8;
        *local_488 = uStack_1bd0;
        local_488[1] = uStack_1bc8;
        if ((int)(local_1640 - 1) < local_1a68 + 7) {
          local_2144 = local_1640 - 1;
        }
        else {
          local_2144 = local_1a68 + 7;
        }
        if ((int)(local_1640 - 1) < local_1a68 + 8) {
          local_2148 = local_1640 - 1;
        }
        else {
          local_2148 = local_1a68 + 8;
        }
        local_15c0 = (undefined8 *)(*pauVar93 + local_2144 * local_1648);
        local_1990 = *local_15c0;
        uStack_1988 = local_15c0[1];
        local_15c8 = (undefined8 *)(*pauVar93 + local_2148 * local_1648);
        local_19a0 = *local_15c8;
        uStack_1998 = local_15c8[1];
        auVar19._16_8_ = local_1990;
        auVar19._0_16_ = auVar53;
        auVar19._24_8_ = uStack_1988;
        auVar18._16_8_ = local_19a0;
        auVar18._0_16_ = auVar54;
        auVar18._24_8_ = uStack_1998;
        local_1720 = vpunpcklbw_avx2(auVar19,auVar18);
        auVar28._16_8_ = local_1990;
        auVar28._0_16_ = auVar55;
        auVar28._24_8_ = uStack_1988;
        auVar27._16_8_ = local_19a0;
        auVar27._0_16_ = auVar56;
        auVar27._24_8_ = uStack_1998;
        local_1680 = vpunpckhbw_avx2(auVar28,auVar27);
        local_17a0 = local_1760;
        local_1780 = _local_1740;
        local_1700 = local_16c0;
        local_16e0 = local_16a0;
        local_1760 = local_1720;
        local_16c0 = local_1680;
        local_1420 = local_19a0;
        uStack_1418 = uStack_1998;
        local_1410 = uVar12;
        uStack_1408 = uVar13;
        local_1400 = local_1990;
        uStack_13f8 = uStack_1988;
        local_13f0 = uVar10;
        uStack_13e8 = uVar11;
        local_1260 = uVar12;
        uStack_1258 = uVar13;
        uStack_1250 = local_19a0;
        uStack_1248 = uStack_1998;
        local_1240 = uVar10;
        uStack_1238 = uVar11;
        uStack_1230 = local_1990;
        uStack_1228 = uStack_1988;
        local_10a0 = uVar12;
        uStack_1098 = uVar13;
        uStack_1090 = local_19a0;
        uStack_1088 = uStack_1998;
        local_1080 = uVar10;
        uStack_1078 = uVar11;
        uStack_1070 = local_1990;
        uStack_1068 = uStack_1988;
        local_520 = uVar81;
      }
      while (local_1c64 < (int)(local_1640 - 1)) {
        if ((int)(local_1640 - 1) < local_1c64 + 5) {
          local_214c = local_1640 - 1;
        }
        else {
          local_214c = local_1c64 + 5;
        }
        if ((int)(local_1640 - 1) < local_1c64 + 6) {
          local_2150 = local_1640 - 1;
        }
        else {
          local_2150 = local_1c64 + 6;
        }
        local_15d0 = (undefined1 (*) [16])(*pauVar93 + local_214c * local_1648);
        uVar10 = *(undefined8 *)*local_15d0;
        uVar11 = *(undefined8 *)(*local_15d0 + 8);
        auVar5 = *local_15d0;
        auVar2 = *local_15d0;
        local_15d8 = (undefined1 (*) [16])(*pauVar93 + local_2150 * local_1648);
        uVar12 = *(undefined8 *)*local_15d8;
        uVar13 = *(undefined8 *)(*local_15d8 + 8);
        auVar6 = *local_15d8;
        auVar103 = *local_15d8;
        local_1430 = local_1990;
        uStack_1428 = uStack_1988;
        local_1450 = local_19a0;
        uStack_1448 = uStack_1998;
        local_1280 = local_1990;
        uStack_1278 = uStack_1988;
        local_12a0 = local_19a0;
        uStack_1298 = uStack_1998;
        auVar17._8_8_ = uStack_1988;
        auVar17._0_8_ = local_1990;
        auVar17._16_8_ = uVar10;
        auVar17._24_8_ = uVar11;
        auVar16._8_8_ = uStack_1998;
        auVar16._0_8_ = local_19a0;
        auVar16._16_8_ = uVar12;
        auVar16._24_8_ = uVar13;
        _local_1740 = vpunpcklbw_avx2(auVar17,auVar16);
        local_10c0 = local_1990;
        uStack_10b8 = uStack_1988;
        local_10e0 = local_19a0;
        uStack_10d8 = uStack_1998;
        auVar26._8_8_ = uStack_1988;
        auVar26._0_8_ = local_1990;
        auVar26._16_8_ = uVar10;
        auVar26._24_8_ = uVar11;
        auVar25._8_8_ = uStack_1998;
        auVar25._0_8_ = local_19a0;
        auVar25._16_8_ = uVar12;
        auVar25._24_8_ = uVar13;
        local_16a0 = vpunpckhbw_avx2(auVar26,auVar25);
        auVar95 = ZEXT832(0) << 0x20;
        in_stack_ffffffffffffdea8 = local_1820;
        auVar99 = auVar95;
        local_1460 = uVar12;
        uStack_1458 = uVar13;
        local_1440 = uVar10;
        uStack_1438 = uVar11;
        uStack_1290 = uVar12;
        uStack_1288 = uVar13;
        uStack_1270 = uVar10;
        uStack_1268 = uVar11;
        uStack_10d0 = uVar12;
        uStack_10c8 = uVar13;
        uStack_10b0 = uVar10;
        uStack_10a8 = uVar11;
        resize_convolve((__m256i *)CONCAT44(in_stack_ffffffffffffdfb4,in_stack_ffffffffffffdfb0),
                        in_stack_ffffffffffffdfa0._8_8_,in_stack_ffffffffffffdfa0._0_8_);
        uVar98 = auVar99._0_8_;
        uVar100 = auVar99._8_8_;
        uVar101 = auVar99._16_8_;
        uVar102 = auVar99._24_8_;
        uStack_1cf8 = SUB328(ZEXT832(0),4);
        local_d80 = 0;
        uStack_d78 = uStack_1cf8;
        uStack_d70 = 0;
        uStack_d68 = 0;
        local_da0 = uVar84;
        uStack_d98 = uVar85;
        uStack_d90 = uVar86;
        uStack_d88 = uVar87;
        auVar44._16_8_ = uVar86;
        auVar44._0_16_ = auVar4;
        auVar44._24_8_ = uVar87;
        auVar7 = vpaddd_avx2(ZEXT832(0) << 0x20,auVar44);
        uStack_1cd8 = SUB328(ZEXT832(0),4);
        local_dc0 = 0;
        uStack_db8 = uStack_1cd8;
        uStack_db0 = 0;
        uStack_da8 = 0;
        local_de0 = uVar84;
        uStack_dd8 = uVar85;
        uStack_dd0 = uVar86;
        uStack_dc8 = uVar87;
        auVar43._16_8_ = uVar86;
        auVar43._0_16_ = auVar4;
        auVar43._24_8_ = uVar87;
        auVar95 = vpaddd_avx2(auVar95,auVar43);
        local_1d20 = auVar7._0_8_;
        uStack_1d18 = auVar7._8_8_;
        uStack_1d10 = auVar7._16_8_;
        uStack_1d08 = auVar7._24_8_;
        local_a80 = local_1d20;
        uStack_a78 = uStack_1d18;
        uStack_a70 = uStack_1d10;
        uStack_a68 = uStack_1d08;
        local_a90 = uVar82;
        uStack_a88 = 0;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = uVar82;
        auVar8 = vpsrad_avx2(auVar7,auVar56);
        local_1d40 = auVar95._0_8_;
        uStack_1d38 = auVar95._8_8_;
        uStack_1d30 = auVar95._16_8_;
        uStack_1d28 = auVar95._24_8_;
        local_ac0 = local_1d40;
        uStack_ab8 = uStack_1d38;
        uStack_ab0 = uStack_1d30;
        uStack_aa8 = uStack_1d28;
        local_ad0 = uVar82;
        uStack_ac8 = 0;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = uVar82;
        auVar9 = vpsrad_avx2(auVar95,auVar55);
        in_stack_ffffffffffffde80 = auVar99;
        resize_convolve((__m256i *)CONCAT44(in_stack_ffffffffffffdfb4,in_stack_ffffffffffffdfb0),
                        in_stack_ffffffffffffdfa0._8_8_,in_stack_ffffffffffffdfa0._0_8_);
        local_e20 = uVar84;
        uStack_e18 = uVar85;
        uStack_e10 = uVar86;
        uStack_e08 = uVar87;
        auVar42._16_8_ = uVar86;
        auVar42._0_16_ = auVar4;
        auVar42._24_8_ = uVar87;
        auVar7 = vpaddd_avx2(auVar99,auVar42);
        local_e60 = uVar84;
        uStack_e58 = uVar85;
        uStack_e50 = uVar86;
        uStack_e48 = uVar87;
        auVar41._16_8_ = uVar86;
        auVar41._0_16_ = auVar4;
        auVar41._24_8_ = uVar87;
        auVar95 = vpaddd_avx2(auVar99,auVar41);
        local_1da0 = auVar7._0_8_;
        uStack_1d98 = auVar7._8_8_;
        uStack_1d90 = auVar7._16_8_;
        uStack_1d88 = auVar7._24_8_;
        local_b00 = local_1da0;
        uStack_af8 = uStack_1d98;
        uStack_af0 = uStack_1d90;
        uStack_ae8 = uStack_1d88;
        local_b10 = uVar82;
        uStack_b08 = 0;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = uVar82;
        auVar99 = vpsrad_avx2(auVar7,auVar54);
        local_1dc0 = auVar95._0_8_;
        uStack_1db8 = auVar95._8_8_;
        uStack_1db0 = auVar95._16_8_;
        uStack_1da8 = auVar95._24_8_;
        local_b40 = local_1dc0;
        uStack_b38 = uStack_1db8;
        uStack_b30 = uStack_1db0;
        uStack_b28 = uStack_1da8;
        local_b50 = uVar82;
        uStack_b48 = 0;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = uVar82;
        auVar95 = vpsrad_avx2(auVar95,auVar53);
        local_1d20 = auVar8._0_8_;
        uStack_1d18 = auVar8._8_8_;
        uStack_1d10 = auVar8._16_8_;
        uStack_1d08 = auVar8._24_8_;
        local_1d40 = auVar9._0_8_;
        uStack_1d38 = auVar9._8_8_;
        uStack_1d30 = auVar9._16_8_;
        uStack_1d28 = auVar9._24_8_;
        local_880 = local_1d20;
        uStack_878 = uStack_1d18;
        uStack_870 = uStack_1d10;
        uStack_868 = uStack_1d08;
        local_8a0 = local_1d40;
        uStack_898 = uStack_1d38;
        uStack_890 = uStack_1d30;
        uStack_888 = uStack_1d28;
        auVar7 = vpackusdw_avx2(auVar8,auVar9);
        local_1da0 = auVar99._0_8_;
        uStack_1d98 = auVar99._8_8_;
        uStack_1d90 = auVar99._16_8_;
        uStack_1d88 = auVar99._24_8_;
        local_1dc0 = auVar95._0_8_;
        uStack_1db8 = auVar95._8_8_;
        uStack_1db0 = auVar95._16_8_;
        uStack_1da8 = auVar95._24_8_;
        local_8c0 = local_1da0;
        uStack_8b8 = uStack_1d98;
        uStack_8b0 = uStack_1d90;
        uStack_8a8 = uStack_1d88;
        local_8e0 = local_1dc0;
        uStack_8d8 = uStack_1db8;
        uStack_8d0 = uStack_1db0;
        uStack_8c8 = uStack_1da8;
        auVar95 = vpackusdw_avx2(auVar99,auVar95);
        auVar7 = vpermq_avx2(auVar7,0xd8);
        auVar95 = vpermq_avx2(auVar95,0xd8);
        local_1de0 = auVar7._0_8_;
        uStack_1dd8 = auVar7._8_8_;
        uStack_1dd0 = auVar7._16_8_;
        uStack_1dc8 = auVar7._24_8_;
        local_1e00 = auVar95._0_8_;
        uStack_1df8 = auVar95._8_8_;
        uStack_1df0 = auVar95._16_8_;
        uStack_1de8 = auVar95._24_8_;
        local_740 = local_1de0;
        uStack_738 = uStack_1dd8;
        uStack_730 = uStack_1dd0;
        uStack_728 = uStack_1dc8;
        local_760 = local_1e00;
        uStack_758 = uStack_1df8;
        uStack_750 = uStack_1df0;
        uStack_748 = uStack_1de8;
        auVar7 = vpackuswb_avx2(auVar7,auVar95);
        local_1e00 = auVar7._0_8_;
        uStack_1df8 = auVar7._8_8_;
        uStack_1df0 = auVar7._16_8_;
        uStack_1de8 = auVar7._24_8_;
        local_640 = local_1e00;
        uStack_638 = uStack_1df8;
        uStack_630 = uStack_1df0;
        uStack_628 = uStack_1de8;
        local_660 = uVar88;
        uStack_658 = uVar89;
        uStack_650 = uVar90;
        uStack_648 = uVar91;
        auVar59._16_8_ = uVar90;
        auVar59._0_16_ = auVar3;
        auVar59._24_8_ = uVar91;
        auVar7 = vpminub_avx2(auVar7,auVar59);
        local_1de0 = auVar7._0_8_;
        uStack_1dd8 = auVar7._8_8_;
        uStack_1dd0 = auVar7._16_8_;
        uStack_1dc8 = auVar7._24_8_;
        local_540 = local_1de0;
        uStack_538 = uStack_1dd8;
        uStack_530 = uStack_1dd0;
        uStack_528 = uStack_1dc8;
        uStack_558 = uVar83;
        uStack_550 = 0;
        uStack_548 = 0;
        auVar7 = vpmaxub_avx2(auVar7,ZEXT832((ulong)uVar83) << 0x40);
        local_4a8 = (undefined8 *)(local_1638 + ((local_1c64 / 2) * local_163c + local_18d0));
        local_1de0 = auVar7._0_8_;
        uStack_1dd8 = auVar7._8_8_;
        uStack_1dd0 = auVar7._16_8_;
        uStack_1dc8 = auVar7._24_8_;
        local_420 = local_1de0;
        uStack_418 = uStack_1dd8;
        uStack_410 = uStack_1dd0;
        uStack_408 = uStack_1dc8;
        local_4c0 = local_1de0;
        uStack_4b8 = uStack_1dd8;
        *local_4a8 = local_1de0;
        local_4a8[1] = uStack_1dd8;
        if (local_1c64 + 2 < (int)(local_1640 - 1)) {
          local_4c8 = (undefined8 *)
                      (local_1638 + (((local_1c64 + 2) / 2) * local_163c + local_18d0));
          local_4e0 = uStack_1dd0;
          uStack_4d8 = uStack_1dc8;
          *local_4c8 = uStack_1dd0;
          local_4c8[1] = uStack_1dc8;
        }
        local_1c64 = local_1c64 + 4;
        local_e40 = uVar98;
        uStack_e38 = uVar100;
        uStack_e30 = uVar101;
        uStack_e28 = uVar102;
        local_e00 = uVar98;
        uStack_df8 = uVar100;
        uStack_df0 = uVar101;
        uStack_de8 = uVar102;
        local_560 = uVar81;
        if (local_1c64 < (int)(local_1640 - 1)) {
          auVar15._16_8_ = uVar12;
          auVar15._0_16_ = auVar2;
          auVar15._24_8_ = uVar13;
          auVar14._16_8_ = uVar12;
          auVar14._0_16_ = auVar103;
          auVar14._24_8_ = uVar13;
          local_1720 = vpunpcklbw_avx2(auVar15,auVar14);
          auVar24._16_8_ = uVar12;
          auVar24._0_16_ = auVar5;
          auVar24._24_8_ = uVar13;
          auVar23._16_8_ = uVar12;
          auVar23._0_16_ = auVar6;
          auVar23._24_8_ = uVar13;
          local_1680 = vpunpckhbw_avx2(auVar24,auVar23);
          local_17a0 = local_1760;
          local_1780 = _local_1740;
          local_1700 = local_16c0;
          local_16e0 = local_16a0;
          local_19a0 = uVar12;
          uStack_1998 = uVar13;
          local_1990 = uVar12;
          uStack_1988 = uVar13;
          local_1760 = local_1720;
          local_16c0 = local_1680;
          local_14a0 = uVar12;
          uStack_1498 = uVar13;
          local_1490 = uVar12;
          uStack_1488 = uVar13;
          local_1480 = uVar12;
          uStack_1478 = uVar13;
          local_1470 = uVar10;
          uStack_1468 = uVar11;
          local_12e0 = uVar12;
          uStack_12d8 = uVar13;
          uStack_12d0 = uVar12;
          uStack_12c8 = uVar13;
          local_12c0 = uVar10;
          uStack_12b8 = uVar11;
          uStack_12b0 = uVar12;
          uStack_12a8 = uVar13;
          local_1120 = uVar12;
          uStack_1118 = uVar13;
          uStack_1110 = uVar12;
          uStack_1108 = uVar13;
          local_1100 = uVar10;
          uStack_10f8 = uVar11;
          uStack_10f0 = uVar12;
          uStack_10e8 = uVar13;
        }
      }
    }
    if (7 < local_18c8) {
      iVar92 = iVar92 * 0x10;
      local_18c8 = local_1648 % 8;
      puVar94 = (ulong *)(local_1630 + iVar92);
      local_2a0 = *puVar94;
      uStack_298 = 0;
      local_2a8 = (ulong *)((long)puVar94 + (long)local_1648);
      local_2c0 = *local_2a8;
      uStack_2b8 = 0;
      local_2c8 = (ulong *)((long)puVar94 + (long)(local_1648 * 2));
      local_2e0 = *local_2c8;
      uStack_2d8 = 0;
      local_2e8 = (ulong *)((long)puVar94 + (long)(local_1648 * 3));
      local_1f20 = *local_2e8;
      uStack_2f8 = 0;
      local_308 = (ulong *)((long)puVar94 + (long)(local_1648 << 2));
      local_1f30 = *local_308;
      uStack_318 = 0;
      uStack_148 = 0;
      uStack_158 = 0;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = local_2a0;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_2a0;
      auVar2 = vpunpcklbw_avx(auVar80,auVar79);
      uStack_168 = 0;
      uStack_178 = 0;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = local_2a0;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = local_2a0;
      auVar103 = vpunpcklbw_avx(auVar78,auVar77);
      uStack_188 = 0;
      uStack_198 = 0;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = local_2c0;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = local_2e0;
      auVar5 = vpunpcklbw_avx(auVar76,auVar75);
      uStack_1a8 = 0;
      uStack_1b8 = 0;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = local_1f20;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = local_1f30;
      auVar6 = vpunpcklbw_avx(auVar74,auVar73);
      local_1f40 = auVar2._0_8_;
      uStack_1f38 = auVar2._8_8_;
      local_14b0 = local_1f40;
      uStack_14a8 = uStack_1f38;
      local_1f50 = auVar103._0_8_;
      uStack_1f48 = auVar103._8_8_;
      local_14c0 = local_1f50;
      uStack_14b8 = uStack_1f48;
      local_17a0._16_8_ = local_1f50;
      local_17a0._24_8_ = uStack_1f48;
      local_17a0._0_16_ = auVar2;
      local_14d0 = local_1f50;
      uStack_14c8 = uStack_1f48;
      local_1f60 = auVar5._0_8_;
      uStack_1f58 = auVar5._8_8_;
      local_14e0 = local_1f60;
      uStack_14d8 = uStack_1f58;
      local_1780._16_8_ = local_1f60;
      local_1780._24_8_ = uStack_1f58;
      local_1780._0_16_ = auVar103;
      local_14f0 = local_1f60;
      uStack_14e8 = uStack_1f58;
      local_1f70 = auVar6._0_8_;
      uStack_1f68 = auVar6._8_8_;
      local_1500 = local_1f70;
      uStack_14f8 = uStack_1f68;
      local_1760._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar5;
      local_1760._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
      local_2044 = local_1640 - local_2044;
      local_320 = local_1f30;
      local_300 = local_1f20;
      local_288 = puVar94;
      local_1c0 = local_1f30;
      local_1b0 = local_1f20;
      local_1a0 = local_2e0;
      local_190 = local_2c0;
      local_180 = local_2a0;
      local_170 = local_2a0;
      local_160 = local_2a0;
      local_150 = local_2a0;
      for (local_1f78 = 0; local_1f78 < local_2044; local_1f78 = local_1f78 + 4) {
        if ((int)(local_1640 - 1) < local_1f78 + 5) {
          local_2184 = local_1640 - 1;
        }
        else {
          local_2184 = local_1f78 + 5;
        }
        if ((int)(local_1640 - 1) < local_1f78 + 6) {
          local_2188 = local_1640 - 1;
        }
        else {
          local_2188 = local_1f78 + 6;
        }
        local_328 = (ulong *)((long)puVar94 + (long)(local_2184 * local_1648));
        local_340 = *local_328;
        uStack_338 = 0;
        local_348 = (ulong *)((long)puVar94 + (long)(local_2188 * local_1648));
        local_360 = *local_348;
        uStack_358 = 0;
        local_1d0 = local_1f20;
        uStack_1c8 = 0;
        local_1e0 = local_1f30;
        uStack_1d8 = 0;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = local_1f20;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = local_1f30;
        auVar2 = vpunpcklbw_avx(auVar72,auVar71);
        uStack_1e8 = 0;
        uStack_1f8 = 0;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = local_340;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = local_360;
        auVar103 = vpunpcklbw_avx(auVar70,auVar69);
        local_1f70 = auVar2._0_8_;
        uStack_1f68 = auVar2._8_8_;
        local_1510 = local_1f70;
        uStack_1508 = uStack_1f68;
        local_1f90 = auVar103._0_8_;
        uStack_1f88 = auVar103._8_8_;
        local_1520 = local_1f90;
        uStack_1518 = uStack_1f88;
        local_1740._16_8_ = local_1f90;
        palStack_1728 = (__m256i *)uStack_1f88;
        local_1740._0_16_ = auVar2;
        auVar95 = ZEXT832(0) << 0x20;
        local_200 = local_360;
        local_1f0 = local_340;
        resize_convolve((__m256i *)CONCAT44(in_stack_ffffffffffffdfb4,in_stack_ffffffffffffdfb0),
                        in_stack_ffffffffffffdfa0._8_8_,in_stack_ffffffffffffdfa0._0_8_);
        local_e80 = 0;
        uStack_1fd8 = SUB328(ZEXT832(0),4);
        uStack_e78 = uStack_1fd8;
        uStack_e70 = 0;
        uStack_e68 = 0;
        local_ea0 = uVar84;
        uStack_e98 = uVar85;
        uStack_e90 = uVar86;
        uStack_e88 = uVar87;
        auVar40._16_8_ = uVar86;
        auVar40._0_16_ = auVar4;
        auVar40._24_8_ = uVar87;
        auVar7 = vpaddd_avx2(auVar95,auVar40);
        local_ec0 = 0;
        uStack_eb8 = uStack_1fd8;
        uStack_eb0 = 0;
        uStack_ea8 = 0;
        local_ee0 = uVar84;
        uStack_ed8 = uVar85;
        uStack_ed0 = uVar86;
        uStack_ec8 = uVar87;
        auVar39._16_8_ = uVar86;
        auVar39._0_16_ = auVar4;
        auVar39._24_8_ = uVar87;
        auVar95 = vpaddd_avx2(auVar95,auVar39);
        local_2000 = auVar7._0_8_;
        local_b80 = local_2000;
        uStack_1ff8 = auVar7._8_8_;
        uStack_b78 = uStack_1ff8;
        uStack_1ff0 = auVar7._16_8_;
        uStack_b70 = uStack_1ff0;
        puStack_1fe8 = auVar7._24_8_;
        uStack_b68 = puStack_1fe8;
        local_b90 = uVar82;
        uStack_b88 = 0;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = uVar82;
        auVar7 = vpsrad_avx2(auVar7,auVar52);
        local_2020 = auVar95._0_8_;
        local_bc0 = local_2020;
        uStack_2018 = auVar95._8_8_;
        uStack_bb8 = uStack_2018;
        uStack_2010 = auVar95._16_8_;
        uStack_bb0 = uStack_2010;
        uStack_2008 = auVar95._24_8_;
        uStack_ba8 = uStack_2008;
        local_bd0 = uVar82;
        uStack_bc8 = 0;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = uVar82;
        auVar95 = vpsrad_avx2(auVar95,auVar51);
        local_2000 = auVar7._0_8_;
        local_900 = local_2000;
        uStack_1ff8 = auVar7._8_8_;
        uStack_8f8 = uStack_1ff8;
        uStack_1ff0 = auVar7._16_8_;
        uStack_8f0 = uStack_1ff0;
        puStack_1fe8 = auVar7._24_8_;
        uStack_8e8 = puStack_1fe8;
        local_2020 = auVar95._0_8_;
        local_920 = local_2020;
        uStack_2018 = auVar95._8_8_;
        uStack_918 = uStack_2018;
        uStack_2010 = auVar95._16_8_;
        uStack_910 = uStack_2010;
        uStack_2008 = auVar95._24_8_;
        uStack_908 = uStack_2008;
        auVar7 = vpackusdw_avx2(auVar7,auVar95);
        auVar7 = vpermq_avx2(auVar7,0xd8);
        local_2000 = auVar7._0_8_;
        local_7a0 = local_2000;
        uStack_1ff8 = auVar7._8_8_;
        uStack_798 = uStack_1ff8;
        uStack_1ff0 = auVar7._16_8_;
        uStack_790 = uStack_1ff0;
        puStack_1fe8 = auVar7._24_8_;
        uStack_788 = puStack_1fe8;
        auVar7 = vpackuswb_avx2(auVar7,auVar7);
        local_2000 = auVar7._0_8_;
        local_680 = local_2000;
        uStack_1ff8 = auVar7._8_8_;
        uStack_678 = uStack_1ff8;
        uStack_1ff0 = auVar7._16_8_;
        uStack_670 = uStack_1ff0;
        puStack_1fe8 = auVar7._24_8_;
        uStack_668 = puStack_1fe8;
        local_6a0 = uVar88;
        uStack_698 = uVar89;
        uStack_690 = uVar90;
        uStack_688 = uVar91;
        auVar58._16_8_ = uVar90;
        auVar58._0_16_ = auVar3;
        auVar58._24_8_ = uVar91;
        auVar7 = vpminub_avx2(auVar7,auVar58);
        local_2000 = auVar7._0_8_;
        local_580 = local_2000;
        uStack_1ff8 = auVar7._8_8_;
        uStack_578 = uStack_1ff8;
        uStack_1ff0 = auVar7._16_8_;
        uStack_570 = uStack_1ff0;
        puStack_1fe8 = auVar7._24_8_;
        uStack_568 = puStack_1fe8;
        uStack_598 = uVar83;
        uStack_590 = 0;
        uStack_588 = 0;
        auVar7 = vpmaxub_avx2(auVar7,ZEXT832((ulong)uVar83) << 0x40);
        local_c8 = (undefined8 *)(local_1638 + ((local_1f78 / 2) * local_163c + iVar92));
        local_2000 = auVar7._0_8_;
        local_440 = local_2000;
        uStack_1ff8 = auVar7._8_8_;
        uStack_438 = uStack_1ff8;
        uStack_1ff0 = auVar7._16_8_;
        uStack_430 = uStack_1ff0;
        puStack_1fe8 = auVar7._24_8_;
        puStack_428 = puStack_1fe8;
        local_e0 = local_2000;
        uStack_d8 = uStack_1ff8;
        *local_c8 = local_2000;
        local_e8 = puStack_1fe8;
        uStack_f0 = uStack_1ff0;
        *puStack_1fe8 = local_100;
        if ((int)(local_1640 - 1) < local_1f78 + 7) {
          local_218c = local_1640 - 1;
        }
        else {
          local_218c = local_1f78 + 7;
        }
        if ((int)(local_1640 - 1) < local_1f78 + 8) {
          local_2190 = local_1640 - 1;
        }
        else {
          local_2190 = local_1f78 + 8;
        }
        local_368 = (ulong *)((long)puVar94 + (long)(local_218c * local_1648));
        local_1f20 = *local_368;
        uStack_378 = 0;
        local_388 = (ulong *)((long)puVar94 + (long)(local_2190 * local_1648));
        local_1f30 = *local_388;
        uStack_398 = 0;
        uStack_208 = 0;
        uStack_218 = 0;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = local_1f20;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = local_1f30;
        auVar2 = vpunpcklbw_avx(auVar68,auVar67);
        local_1530 = local_1f90;
        uStack_1528 = uStack_1f88;
        local_2040 = auVar2._0_8_;
        local_1540 = local_2040;
        uStack_2038 = auVar2._8_8_;
        uStack_1538 = uStack_2038;
        auVar96._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar103;
        auVar96._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
        local_17a0 = local_1760;
        local_1780 = _local_1740;
        local_1720._16_8_ = auVar96._16_8_;
        local_1720._24_8_ = auVar96._24_8_;
        local_1760._16_8_ = local_1720._16_8_;
        local_1760._0_16_ = auVar96._0_16_;
        local_1760._24_8_ = local_1720._24_8_;
        local_1720 = auVar96;
        local_780 = local_7a0;
        uStack_778 = uStack_798;
        uStack_770 = uStack_790;
        uStack_768 = uStack_788;
        local_5a0 = uVar81;
        local_3a0 = local_1f30;
        local_380 = local_1f20;
        local_220 = local_1f30;
        local_210 = local_1f20;
      }
      while (start_col_00 = (int)in_stack_ffffffffffffdea8, local_2044 < (int)(local_1640 - 1)) {
        if ((int)(local_1640 - 1) < local_2044 + 5) {
          local_2194 = local_1640 - 1;
        }
        else {
          local_2194 = local_2044 + 5;
        }
        if ((int)(local_1640 - 1) < local_2044 + 6) {
          local_2198 = local_1640 - 1;
        }
        else {
          local_2198 = local_2044 + 6;
        }
        local_3a8 = (ulong *)((long)puVar94 + (long)(local_2194 * local_1648));
        local_3c0 = *local_3a8;
        uStack_3b8 = 0;
        local_3c8 = (ulong *)((long)puVar94 + (long)(local_2198 * local_1648));
        uVar1 = *local_3c8;
        uStack_3d8 = 0;
        local_230 = local_1f20;
        uStack_228 = 0;
        local_240 = local_1f30;
        uStack_238 = 0;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = local_1f20;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = local_1f30;
        auVar2 = vpunpcklbw_avx(auVar66,auVar65);
        uStack_248 = 0;
        uStack_258 = 0;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = local_3c0;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = uVar1;
        auVar103 = vpunpcklbw_avx(auVar64,auVar63);
        local_1f70 = auVar2._0_8_;
        uStack_1f68 = auVar2._8_8_;
        local_1550 = local_1f70;
        uStack_1548 = uStack_1f68;
        local_1560 = auVar103._0_8_;
        palStack_1558 = auVar103._8_8_;
        local_1740._16_8_ = local_1560;
        palStack_1728 = palStack_1558;
        local_1740._0_16_ = auVar2;
        auVar95 = ZEXT832(0) << 0x20;
        local_3e0 = uVar1;
        local_260 = uVar1;
        local_250 = local_3c0;
        resize_convolve((__m256i *)CONCAT44(local_2198,in_stack_ffffffffffffdfb0),palStack_1558,
                        local_1560);
        uStack_2098 = SUB328(ZEXT832(0),4);
        local_f00 = 0;
        uStack_ef8 = uStack_2098;
        uStack_ef0 = 0;
        uStack_ee8 = 0;
        local_f20 = uVar84;
        uStack_f18 = uVar85;
        uStack_f10 = uVar86;
        uStack_f08 = uVar87;
        auVar38._16_8_ = uVar86;
        auVar38._0_16_ = auVar4;
        auVar38._24_8_ = uVar87;
        auVar7 = vpaddd_avx2(auVar95,auVar38);
        local_f40 = 0;
        uStack_f38 = uStack_2098;
        uStack_f30 = 0;
        uStack_f28 = 0;
        local_f60 = uVar84;
        uStack_f58 = uVar85;
        uStack_f50 = uVar86;
        uStack_f48 = uVar87;
        auVar37._16_8_ = uVar86;
        auVar37._0_16_ = auVar4;
        auVar37._24_8_ = uVar87;
        auVar95 = vpaddd_avx2(auVar95,auVar37);
        local_20c0 = auVar7._0_8_;
        uStack_20b8 = auVar7._8_8_;
        uStack_20b0 = auVar7._16_8_;
        puStack_20a8 = auVar7._24_8_;
        local_c00 = local_20c0;
        uStack_bf8 = uStack_20b8;
        uStack_bf0 = uStack_20b0;
        uStack_be8 = puStack_20a8;
        local_c10 = uVar82;
        uStack_c08 = 0;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = uVar82;
        auVar7 = vpsrad_avx2(auVar7,auVar50);
        local_20e0 = auVar95._0_8_;
        uStack_20d8 = auVar95._8_8_;
        uStack_20d0 = auVar95._16_8_;
        uStack_20c8 = auVar95._24_8_;
        local_c40 = local_20e0;
        uStack_c38 = uStack_20d8;
        uStack_c30 = uStack_20d0;
        uStack_c28 = uStack_20c8;
        local_c50 = uVar82;
        uStack_c48 = 0;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = uVar82;
        auVar95 = vpsrad_avx2(auVar95,auVar49);
        local_20c0 = auVar7._0_8_;
        uStack_20b8 = auVar7._8_8_;
        uStack_20b0 = auVar7._16_8_;
        puStack_20a8 = auVar7._24_8_;
        local_20e0 = auVar95._0_8_;
        uStack_20d8 = auVar95._8_8_;
        uStack_20d0 = auVar95._16_8_;
        uStack_20c8 = auVar95._24_8_;
        local_940 = local_20c0;
        uStack_938 = uStack_20b8;
        uStack_930 = uStack_20b0;
        uStack_928 = puStack_20a8;
        local_960 = local_20e0;
        uStack_958 = uStack_20d8;
        uStack_950 = uStack_20d0;
        uStack_948 = uStack_20c8;
        auVar7 = vpackusdw_avx2(auVar7,auVar95);
        auVar7 = vpermq_avx2(auVar7,0xd8);
        local_20c0 = auVar7._0_8_;
        uStack_20b8 = auVar7._8_8_;
        uStack_20b0 = auVar7._16_8_;
        puStack_20a8 = auVar7._24_8_;
        local_7c0 = local_20c0;
        uStack_7b8 = uStack_20b8;
        uStack_7b0 = uStack_20b0;
        uStack_7a8 = puStack_20a8;
        local_7e0 = local_20c0;
        uStack_7d8 = uStack_20b8;
        uStack_7d0 = uStack_20b0;
        uStack_7c8 = puStack_20a8;
        auVar7 = vpackuswb_avx2(auVar7,auVar7);
        local_20c0 = auVar7._0_8_;
        uStack_20b8 = auVar7._8_8_;
        uStack_20b0 = auVar7._16_8_;
        puStack_20a8 = auVar7._24_8_;
        local_6c0 = local_20c0;
        uStack_6b8 = uStack_20b8;
        uStack_6b0 = uStack_20b0;
        uStack_6a8 = puStack_20a8;
        local_6e0 = uVar88;
        uStack_6d8 = uVar89;
        uStack_6d0 = uVar90;
        uStack_6c8 = uVar91;
        auVar57._16_8_ = uVar90;
        auVar57._0_16_ = auVar3;
        auVar57._24_8_ = uVar91;
        auVar7 = vpminub_avx2(auVar7,auVar57);
        local_20c0 = auVar7._0_8_;
        uStack_20b8 = auVar7._8_8_;
        uStack_20b0 = auVar7._16_8_;
        puStack_20a8 = auVar7._24_8_;
        local_5c0 = local_20c0;
        uStack_5b8 = uStack_20b8;
        uStack_5b0 = uStack_20b0;
        uStack_5a8 = puStack_20a8;
        uStack_5d8 = uVar83;
        uStack_5d0 = 0;
        uStack_5c8 = 0;
        auVar7 = vpmaxub_avx2(auVar7,ZEXT832((ulong)uVar83) << 0x40);
        local_108 = (undefined8 *)(local_1638 + ((local_2044 / 2) * local_163c + iVar92));
        local_20c0 = auVar7._0_8_;
        uStack_20b8 = auVar7._8_8_;
        uStack_20b0 = auVar7._16_8_;
        puStack_20a8 = auVar7._24_8_;
        local_460 = local_20c0;
        uStack_458 = uStack_20b8;
        uStack_450 = uStack_20b0;
        puStack_448 = puStack_20a8;
        local_120 = local_20c0;
        uStack_118 = uStack_20b8;
        *local_108 = local_20c0;
        if (local_2044 + 2 < (int)(local_1640 - 1)) {
          local_128 = puStack_20a8;
          uStack_130 = uStack_20b0;
          *puStack_20a8 = local_140;
        }
        local_2044 = local_2044 + 4;
        local_5e0 = uVar81;
        if (local_2044 < (int)(local_1640 - 1)) {
          uStack_268 = 0;
          uStack_278 = 0;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uVar1;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = uVar1;
          auVar2 = vpunpcklbw_avx(auVar62,auVar61);
          local_1570 = auVar103._0_8_;
          uStack_1568 = auVar103._8_8_;
          local_2100 = auVar2._0_8_;
          uStack_20f8 = auVar2._8_8_;
          local_1580 = local_2100;
          uStack_1578 = uStack_20f8;
          auVar97._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar103;
          auVar97._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
          local_17a0 = local_1760;
          local_1780 = _local_1740;
          local_1720._16_8_ = auVar97._16_8_;
          local_1720._24_8_ = auVar97._24_8_;
          local_1760._16_8_ = local_1720._16_8_;
          local_1760._0_16_ = auVar97._0_16_;
          local_1760._24_8_ = local_1720._24_8_;
          local_1f30 = uVar1;
          local_1f20 = uVar1;
          local_1720 = auVar97;
          local_280 = uVar1;
          local_270 = uVar1;
        }
      }
    }
    if (local_18c8 == 0) {
      local_1621 = true;
    }
    else {
      local_1621 = av1_resize_vert_dir_c
                             (in_stack_ffffffffffffde80._24_8_,in_stack_ffffffffffffde80._16_8_,
                              in_stack_ffffffffffffde80._12_4_,in_stack_ffffffffffffde80._8_4_,
                              in_stack_ffffffffffffde80._4_4_,in_stack_ffffffffffffde80._0_4_,
                              start_col_00);
    }
  }
  else {
    local_1621 = av1_resize_vert_dir_c
                           (in_stack_ffffffffffffde80._24_8_,in_stack_ffffffffffffde80._16_8_,
                            in_stack_ffffffffffffde80._12_4_,in_stack_ffffffffffffde80._8_4_,
                            in_stack_ffffffffffffde80._4_4_,in_stack_ffffffffffffde80._0_4_,
                            (int)in_stack_ffffffffffffdea8);
  }
  return local_1621;
}

Assistant:

bool av1_resize_vert_dir_avx2(uint8_t *intbuf, uint8_t *output, int out_stride,
                              int height, int height2, int stride,
                              int start_col) {
  assert(start_col <= stride);
  // For the GM tool, the input layer height or width is assured to be an even
  // number. Hence the function 'down2_symodd()' is not invoked and SIMD
  // optimization of the same is not implemented.
  // When the input height is less than 8 and even, the potential input
  // heights are limited to 2, 4, or 6. These scenarios require seperate
  // handling due to padding requirements. Invoking the C function here will
  // eliminate the need for conditional statements within the subsequent SIMD
  // code to manage these cases.
  if (height & 1 || height < 8) {
    return av1_resize_vert_dir_c(intbuf, output, out_stride, height, height2,
                                 stride, start_col);
  }

  __m256i s[10], coeffs_y[4];
  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const uint8_t max_pixel = 255;
  const __m256i clip_pixel = _mm256_set1_epi8((char)max_pixel);
  const __m256i zero = _mm256_setzero_si256();

  prepare_filter_coeffs(av1_down2_symeven_half_filter, coeffs_y);

  const int num_col16 = stride / 16;
  int remain_col = stride % 16;
  // The core vertical SIMD processes 4 input rows simultaneously to generate
  // output corresponding to 2 rows. To streamline the core loop and eliminate
  // the need for conditional checks, the remaining rows (4 or 6) are processed
  // separately.
  const int remain_row = (height % 4 == 0) ? 4 : 6;

  for (int j = start_col; j < stride - remain_col; j += 16) {
    const uint8_t *data = &intbuf[j];
    const __m128i l3 = _mm_loadu_si128((__m128i *)(data + 0 * stride));
    // Padding top 3 rows with the last available row at the top.
    const __m128i l0 = l3;
    const __m128i l1 = l3;
    const __m128i l2 = l3;
    const __m128i l4 = _mm_loadu_si128((__m128i *)(data + 1 * stride));

    __m128i l6, l7, l8, l9;
    __m128i l5 = _mm_loadu_si128((__m128i *)(data + 2 * stride));
    __m128i l10 = _mm_loadu_si128((__m128i *)(data + 3 * stride));
    __m128i l11 = _mm_loadu_si128((__m128i *)(data + 4 * stride));

    // a0...a15 | c0...c15
    const __m256i s02 =
        _mm256_permute2x128_si256(CAST_HI(l0), CAST_HI(l2), 0x20);
    // b0...b15 | d0...d15
    const __m256i s13 =
        _mm256_permute2x128_si256(CAST_HI(l1), CAST_HI(l3), 0x20);
    // c0...c15 | e0...e15
    const __m256i s24 =
        _mm256_permute2x128_si256(CAST_HI(l2), CAST_HI(l4), 0x20);
    // d0...d15 | f0...f15
    const __m256i s35 =
        _mm256_permute2x128_si256(CAST_HI(l3), CAST_HI(l5), 0x20);
    // e0...e15 | g0...g15
    const __m256i s46 =
        _mm256_permute2x128_si256(CAST_HI(l4), CAST_HI(l10), 0x20);
    // f0...f15 | h0...h15
    const __m256i s57 =
        _mm256_permute2x128_si256(CAST_HI(l5), CAST_HI(l11), 0x20);

    // a0b0...a7b7 | c0d0...c7d7
    s[0] = _mm256_unpacklo_epi8(s02, s13);
    // c0d0...c7d7 | e0f0...e7f7
    s[1] = _mm256_unpacklo_epi8(s24, s35);
    // e0f0...e7f7 | g0h0...g7h7
    s[2] = _mm256_unpacklo_epi8(s46, s57);

    // a8b8...a15b15 | c8d8...c15d15
    s[5] = _mm256_unpackhi_epi8(s02, s13);
    // c8d8...c15d15 | e8f8...e15f15
    s[6] = _mm256_unpackhi_epi8(s24, s35);
    // e8f8...e15f15 | g8h8...g15h15
    s[7] = _mm256_unpackhi_epi8(s46, s57);

    // height to be processed here
    const int process_ht = height - remain_row;
    for (int i = 0; i < process_ht; i += 4) {
      PROCESS_RESIZE_Y_WD16

      _mm_storeu_si128((__m128i *)&output[(i / 2) * out_stride + j],
                       CAST_LOW(res_8bit0));

      _mm_storeu_si128(
          (__m128i *)&output[(i / 2) * out_stride + j + out_stride],
          _mm256_extracti128_si256(res_8bit0, 1));

      // Load the required data for processing of next 4 input rows.
      const int idx7 = AOMMIN(height - 1, i + 7);
      const int idx8 = AOMMIN(height - 1, i + 8);
      l10 = _mm_loadu_si128((__m128i *)(data + idx7 * stride));
      l11 = _mm_loadu_si128((__m128i *)(data + idx8 * stride));

      const __m256i s810 =
          _mm256_permute2x128_si256(CAST_HI(l8), CAST_HI(l10), 0x20);
      const __m256i s911 =
          _mm256_permute2x128_si256(CAST_HI(l9), CAST_HI(l11), 0x20);
      // i0j0... i7j7 | k0l0... k7l7
      s[4] = _mm256_unpacklo_epi8(s810, s911);
      // i8j8... i15j15 | k8l8... k15l15
      s[9] = _mm256_unpackhi_epi8(s810, s911);

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];

      s[5] = s[7];
      s[6] = s[8];
      s[7] = s[9];
    }

    // Process the remaining last 4 or 6 rows here.
    int i = process_ht;
    while (i < height - 1) {
      PROCESS_RESIZE_Y_WD16

      _mm_storeu_si128((__m128i *)&output[(i / 2) * out_stride + j],
                       CAST_LOW(res_8bit0));
      i += 2;

      const int is_store_valid = (i < height - 1);
      if (is_store_valid)
        _mm_storeu_si128((__m128i *)&output[(i / 2) * out_stride + j],
                         _mm256_extracti128_si256(res_8bit0, 1));
      i += 2;

      // Check if there is any remaining height to process. If so, perform the
      // necessary data loading for processing the next row.
      if (i < height - 1) {
        l10 = l11 = l9;
        const __m256i s810 =
            _mm256_permute2x128_si256(CAST_HI(l8), CAST_HI(l10), 0x20);
        const __m256i s911 =
            _mm256_permute2x128_si256(CAST_HI(l9), CAST_HI(l11), 0x20);
        // i0j0... i7j7 | k0l0... k7l7
        s[4] = _mm256_unpacklo_epi8(s810, s911);
        // i8j8... i15j15 | k8l8... k15l15
        s[9] = _mm256_unpackhi_epi8(s810, s911);

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];

        s[5] = s[7];
        s[6] = s[8];
        s[7] = s[9];
      }
    }
  }

  if (remain_col > 7) {
    const int processed_wd = num_col16 * 16;
    remain_col = stride % 8;

    const uint8_t *data = &intbuf[processed_wd];

    const __m128i l3 = _mm_loadl_epi64((__m128i *)(data + 0 * stride));
    // Padding top 3 rows with available top-most row.
    const __m128i l0 = l3;
    const __m128i l1 = l3;
    const __m128i l2 = l3;
    const __m128i l4 = _mm_loadl_epi64((__m128i *)(data + 1 * stride));

    __m128i l6, l7, l8, l9;
    __m128i l5 = _mm_loadl_epi64((__m128i *)(data + 2 * stride));
    __m128i l10 = _mm_loadl_epi64((__m128i *)(data + 3 * stride));
    __m128i l11 = _mm_loadl_epi64((__m128i *)(data + 4 * stride));

    // a0b0...a7b7
    const __m128i s01 = _mm_unpacklo_epi8(l0, l1);
    // c0d0...c7d7
    const __m128i s23 = _mm_unpacklo_epi8(l2, l3);
    // e0f0...e7f7
    const __m128i s45 = _mm_unpacklo_epi8(l4, l5);
    // g0h0...g7h7
    __m128i s67 = _mm_unpacklo_epi8(l10, l11);

    // a0b0...a7b7 | c0d0...c7d7
    s[0] = _mm256_permute2x128_si256(CAST_HI(s01), CAST_HI(s23), 0x20);
    // c0d0...c7d7 | e0f0...e7f7
    s[1] = _mm256_permute2x128_si256(CAST_HI(s23), CAST_HI(s45), 0x20);
    // e0f0...e7f7 | g0h0...g7h7
    s[2] = _mm256_permute2x128_si256(CAST_HI(s45), CAST_HI(s67), 0x20);

    // height to be processed here
    const int process_ht = height - remain_row;
    for (int i = 0; i < process_ht; i += 4) {
      PROCESS_RESIZE_Y_WD8

      _mm_storel_epi64((__m128i *)&output[(i / 2) * out_stride + processed_wd],
                       CAST_LOW(res_a_round_1));

      _mm_storel_epi64(
          (__m128i *)&output[(i / 2) * out_stride + processed_wd + out_stride],
          _mm256_extracti128_si256(res_a_round_1, 1));

      const int idx7 = AOMMIN(height - 1, i + 7);
      const int idx8 = AOMMIN(height - 1, i + 8);
      l10 = _mm_loadl_epi64((__m128i *)(data + idx7 * stride));
      l11 = _mm_loadl_epi64((__m128i *)(data + idx8 * stride));

      // k0l0... k7l7
      const __m128i s10s11 = _mm_unpacklo_epi8(l10, l11);
      // i0j0... i7j7 | k0l0... k7l7
      s[4] = _mm256_permute2x128_si256(CAST_HI(s89), CAST_HI(s10s11), 0x20);

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];
    }

    // Process the remaining last 4 or 6 rows here.
    int i = process_ht;
    while (i < height - 1) {
      PROCESS_RESIZE_Y_WD8

      _mm_storel_epi64((__m128i *)&output[(i / 2) * out_stride + processed_wd],
                       CAST_LOW(res_a_round_1));

      i += 2;

      const int is_store_valid = (i < height - 1);
      if (is_store_valid)
        _mm_storel_epi64(
            (__m128i *)&output[(i / 2) * out_stride + processed_wd],
            _mm256_extracti128_si256(res_a_round_1, 1));
      i += 2;

      // Check rows are still remaining for processing. If yes do the required
      // load of data for the next iteration.
      if (i < height - 1) {
        l10 = l11 = l9;
        // k0l0... k7l7
        const __m128i s10s11 = _mm_unpacklo_epi8(l10, l11);
        // i0j0... i7j7 | k0l0... k7l7
        s[4] = _mm256_permute2x128_si256(CAST_HI(s89), CAST_HI(s10s11), 0x20);

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];
      }
    }
  }

  if (remain_col)
    return av1_resize_vert_dir_c(intbuf, output, out_stride, height, height2,
                                 stride, stride - remain_col);

  return true;
}